

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O3

void __thiscall
chrono::ChAssembly::ShowHierarchy(ChAssembly *this,ChStreamOutAscii *m_file,int level)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pointer psVar7;
  pointer psVar8;
  element_type *peVar9;
  ChStreamOutAscii *pCVar10;
  element_type *peVar11;
  long lVar12;
  ChAssembly *this_00;
  int iVar13;
  shared_ptr<chrono::ChMarker> *marker;
  pointer psVar14;
  pointer psVar15;
  pointer psVar16;
  shared_ptr<chrono::ChShaft> *shaft;
  pointer psVar17;
  pointer psVar18;
  pointer psVar19;
  shared_ptr<chrono::ChBody> *body;
  string mtabs;
  pointer local_60;
  string local_58;
  pointer local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if (0 < level) {
    iVar13 = level;
    do {
      std::__cxx11::string::append((char *)&local_58);
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  pCVar10 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,&local_58);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"List of the ");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,(int)((ulong)((long)(this->bodylist).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->bodylist).
                                                  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar10," added rigid bodies: \n");
  local_60 = (this->bodylist).
             super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->bodylist).
             super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_60 != local_38) {
    do {
      pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_58);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"  BODY:       ");
      pCVar10 = ChStreamOutAscii::operator<<
                          (pCVar10,(((local_60->
                                     super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)
                                    ._M_ptr)->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus.
                                   _M_p);
      ChStreamOutAscii::operator<<(pCVar10,"\n");
      peVar11 = (local_60->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar14 = (peVar11->marklist).
                super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (peVar11->marklist).
               super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar14 != psVar1) {
        do {
          pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_58);
          pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"    MARKER:  ");
          pCVar10 = ChStreamOutAscii::operator<<
                              (pCVar10,(((psVar14->
                                         super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->super_ChObj).m_name._M_dataplus._M_p);
          ChStreamOutAscii::operator<<(pCVar10,"\n");
          psVar14 = psVar14 + 1;
        } while (psVar14 != psVar1);
        peVar11 = (local_60->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      psVar2 = (peVar11->forcelist).
               super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar15 = (peVar11->forcelist).
                     super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar2;
          psVar15 = psVar15 + 1) {
        pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_58);
        pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"    FORCE:  ");
        pCVar10 = ChStreamOutAscii::operator<<
                            (pCVar10,(((psVar15->
                                       super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->super_ChObj).m_name._M_dataplus._M_p);
        ChStreamOutAscii::operator<<(pCVar10,"\n");
      }
      local_60 = local_60 + 1;
    } while (local_60 != local_38);
  }
  pCVar10 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,&local_58);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"List of the ");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,(int)((ulong)((long)(this->shaftlist).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->shaftlist).
                                                  super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar10," added shafts: \n");
  psVar17 = (this->shaftlist).
            super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->shaftlist).
           super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar17 != psVar3) {
    do {
      pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_58);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"  SHAFT:      ");
      pCVar10 = ChStreamOutAscii::operator<<
                          (pCVar10,(((psVar17->
                                     super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus.
                                   _M_p);
      ChStreamOutAscii::operator<<(pCVar10,"\n");
      psVar17 = psVar17 + 1;
    } while (psVar17 != psVar3);
  }
  pCVar10 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,&local_58);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"List of the ");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,(int)((ulong)((long)(this->linklist).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->linklist).
                                                  super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar10," added links: \n");
  psVar16 = (this->linklist).
            super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->linklist).
           super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar16 != psVar4) {
    do {
      pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_58);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"  LINK:       ");
      pCVar10 = ChStreamOutAscii::operator<<
                          (pCVar10,(((psVar16->
                                     super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus.
                                   _M_p);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10," [");
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"PN6chrono10ChLinkBaseE");
      ChStreamOutAscii::operator<<(pCVar10,"]\n");
      peVar5 = (psVar16->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar5 != (element_type *)0x0) {
        lVar12 = __dynamic_cast(peVar5,&ChLinkBase::typeinfo,&ChLinkMarkers::typeinfo,0);
        if (lVar12 != 0) {
          p_Var6 = (psVar16->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          if (*(long *)(lVar12 + 0xb8) != 0) {
            pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_58);
            pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"    marker1:  ");
            pCVar10 = ChStreamOutAscii::operator<<(pCVar10,*(char **)(*(long *)(lVar12 + 0xb8) + 8))
            ;
            ChStreamOutAscii::operator<<(pCVar10,"\n");
          }
          if (*(long *)(lVar12 + 0xc0) != 0) {
            pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_58);
            pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"    marker2:  ");
            pCVar10 = ChStreamOutAscii::operator<<(pCVar10,*(char **)(*(long *)(lVar12 + 0xc0) + 8))
            ;
            ChStreamOutAscii::operator<<(pCVar10,"\n");
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
        }
      }
      psVar16 = psVar16 + 1;
    } while (psVar16 != psVar4);
  }
  pCVar10 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,&local_58);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"List of the ");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,(int)((ulong)((long)(this->meshlist).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->meshlist).
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar10," added meshes: \n");
  psVar18 = (this->meshlist).
            super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (this->meshlist).
           super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar18 != psVar7) {
    do {
      pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_58);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"  MESH :      ");
      pCVar10 = ChStreamOutAscii::operator<<
                          (pCVar10,(((psVar18->
                                     super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_ChIndexedNodes).super_ChPhysicsItem.
                                   super_ChObj.m_name._M_dataplus._M_p);
      ChStreamOutAscii::operator<<(pCVar10,"\n");
      psVar18 = psVar18 + 1;
    } while (psVar18 != psVar7);
  }
  pCVar10 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,&local_58);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"List of other ");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,(int)((ulong)((long)(this->otherphysicslist).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->otherphysicslist).
                                                  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar10," added physic items: \n");
  psVar19 = (this->otherphysicslist).
            super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar8 = (this->otherphysicslist).
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar19 != psVar8) {
    do {
      pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_58);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"  PHYSIC ITEM: ");
      pCVar10 = ChStreamOutAscii::operator<<
                          (pCVar10,(((psVar19->
                                     super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_ChObj).m_name._M_dataplus._M_p);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10," [");
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"PN6chrono13ChPhysicsItemE");
      ChStreamOutAscii::operator<<(pCVar10,"]\n");
      peVar9 = (psVar19->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar9 != (element_type *)0x0) {
        this_00 = (ChAssembly *)__dynamic_cast(peVar9,&ChPhysicsItem::typeinfo,&typeinfo,0);
        if (this_00 != (ChAssembly *)0x0) {
          p_Var6 = (psVar19->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          ShowHierarchy(this_00,m_file,level + 1);
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
        }
      }
      psVar19 = psVar19 + 1;
    } while (psVar19 != psVar8);
  }
  ChStreamOutAscii::operator<<(m_file,"\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ChAssembly::ShowHierarchy(ChStreamOutAscii& m_file, int level) const {
    std::string mtabs;
    for (int i = 0; i < level; ++i)
        mtabs += "  ";

    m_file << "\n" << mtabs << "List of the " << (int)bodylist.size() << " added rigid bodies: \n";
    for (auto& body : bodylist) {
        m_file << mtabs << "  BODY:       " << body->GetName() << "\n";

        for (auto& marker : body->GetMarkerList()) {
            m_file << mtabs << "    MARKER:  " << marker->GetName() << "\n";
        }

        for (auto& force : body->GetForceList()) {
            m_file << mtabs << "    FORCE:  " << force->GetName() << "\n";
        }
    }

    m_file << "\n" << mtabs << "List of the " << (int)shaftlist.size() << " added shafts: \n";
    for (auto& shaft : shaftlist) {
        m_file << mtabs << "  SHAFT:      " << shaft->GetName() << "\n";
    }

    m_file << "\n" << mtabs << "List of the " << (int)linklist.size() << " added links: \n";
    for (auto& link : linklist) {
        m_file << mtabs << "  LINK:       " << link->GetName() << " [" << typeid(link.get()).name() << "]\n";
        if (auto malink = std::dynamic_pointer_cast<ChLinkMarkers>(link)) {
            if (malink->GetMarker1())
                m_file << mtabs << "    marker1:  " << malink->GetMarker1()->GetName() << "\n";
            if (malink->GetMarker2())
                m_file << mtabs << "    marker2:  " << malink->GetMarker2()->GetName() << "\n";
        }
    }

    m_file << "\n" << mtabs << "List of the " << (int)meshlist.size() << " added meshes: \n";
    for (auto& mesh : meshlist) {
        m_file << mtabs << "  MESH :      " << mesh->GetName() << "\n";
    }

    m_file << "\n" << mtabs << "List of other " << (int)otherphysicslist.size() << " added physic items: \n";
    for (auto& item : otherphysicslist) {
        m_file << mtabs << "  PHYSIC ITEM: " << item->GetName() << " [" << typeid(item.get()).name() << "]\n";

        // recursion:
        if (auto assem = std::dynamic_pointer_cast<ChAssembly>(item))
            assem->ShowHierarchy(m_file, level + 1);
    }

    m_file << "\n\n";
}